

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

void SetRotation(FLinePortal *port)

{
  line_t *plVar1;
  double dVar2;
  undefined1 local_60 [40];
  TVector2<double> local_38;
  TAngle<double> local_28;
  DAngle angle;
  line_t *line;
  line_t *dst;
  FLinePortal *port_local;
  
  if ((port != (FLinePortal *)0x0) && (port->mDestination != (line_t *)0x0)) {
    if (port->mType == '\x03') {
      port->mSinRot = 0.0;
      port->mCosRot = 1.0;
      TAngle<double>::operator=(&port->mAngleDiff,0.0);
    }
    else {
      plVar1 = port->mDestination;
      angle.Degrees = (double)port->mOrigin;
      line_t::Delta((line_t *)(local_60 + 0x18));
      TVector2<double>::Angle(&local_38);
      line_t::Delta((line_t *)local_60);
      TVector2<double>::Angle((TVector2<double> *)(local_60 + 0x10));
      TAngle<double>::operator-((TAngle<double> *)&local_38.Y,(TAngle<double> *)&local_38);
      TAngle<double>::operator+(&local_28,180.0);
      dVar2 = sindeg(local_28.Degrees);
      port->mSinRot = dVar2;
      dVar2 = cosdeg(local_28.Degrees);
      port->mCosRot = dVar2;
      TAngle<double>::operator=(&port->mAngleDiff,&local_28);
      if (((*(byte *)(*(long *)((long)angle.Degrees + 0x48) + 0xb4) & 0x40) == 0) &&
         ((plVar1->sidedef[0]->Flags & 0x40) == 0)) {
        port->mFlags = port->mFlags & 0xef;
      }
      else {
        port->mFlags = port->mFlags | 0x10;
      }
    }
  }
  return;
}

Assistant:

static void SetRotation(FLinePortal *port)
{
	if (port != nullptr && port->mDestination != nullptr)
	{
		if (port->mType != PORTT_LINKED)
		{
			line_t *dst = port->mDestination;
			line_t *line = port->mOrigin;
			DAngle angle = dst->Delta().Angle() - line->Delta().Angle() + 180.;
			port->mSinRot = sindeg(angle.Degrees);	// Here precision matters so use the slower but more precise versions.
			port->mCosRot = cosdeg(angle.Degrees);
			port->mAngleDiff = angle;
			if ((line->sidedef[0]->Flags & WALLF_POLYOBJ) || (dst->sidedef[0]->Flags & WALLF_POLYOBJ))
			{
				port->mFlags |= PORTF_POLYOBJ;
			}
			else
			{
				port->mFlags &= ~PORTF_POLYOBJ;
			}
		}
		else
		{
			// Linked portals have no angular difference.
			port->mSinRot = 0.;
			port->mCosRot = 1.;
			port->mAngleDiff = 0.;
		}
	}
}